

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeamCityTestOutput.cpp
# Opt level: O0

void __thiscall TeamCityTestOutput::printFailure(TeamCityTestOutput *this,TestFailure *failure)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SimpleString local_68;
  SimpleString local_58;
  SimpleString local_48 [2];
  SimpleString local_28;
  TestFailure *local_18;
  TestFailure *failure_local;
  TeamCityTestOutput *this_local;
  
  local_18 = failure;
  failure_local = (TestFailure *)this;
  (*(this->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[0xb])
            (this,"##teamcity[testFailed name=\'");
  (*local_18->_vptr_TestFailure[4])();
  pcVar3 = SimpleString::asCharString(&local_28);
  printEscaped(this,pcVar3);
  SimpleString::~SimpleString(&local_28);
  (*(this->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[0xb])(this,"\' message=\'");
  bVar1 = TestFailure::isOutsideTestFile(local_18);
  if ((bVar1) || (bVar1 = TestFailure::isInHelperFunction(local_18), bVar1)) {
    (*(this->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[0xb])(this,"TEST failed (");
    (*local_18->_vptr_TestFailure[7])();
    pcVar3 = SimpleString::asCharString(local_48);
    (*(this->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[0xb])(this,pcVar3);
    SimpleString::~SimpleString(local_48);
    (*(this->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[0xb])(this,":");
    iVar2 = (*local_18->_vptr_TestFailure[8])();
    (*(this->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[0xd])
              (this,CONCAT44(extraout_var,iVar2));
    (*(this->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[0xb])(this,"): ");
  }
  (*local_18->_vptr_TestFailure[2])();
  pcVar3 = SimpleString::asCharString(&local_58);
  printEscaped(this,pcVar3);
  SimpleString::~SimpleString(&local_58);
  (*(this->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[0xb])(this,":");
  iVar2 = (*local_18->_vptr_TestFailure[5])();
  (*(this->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[0xd])
            (this,CONCAT44(extraout_var_00,iVar2));
  (*(this->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[0xb])(this,"\' details=\'");
  (*local_18->_vptr_TestFailure[6])();
  pcVar3 = SimpleString::asCharString(&local_68);
  printEscaped(this,pcVar3);
  SimpleString::~SimpleString(&local_68);
  (*(this->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[0xb])(this,"\']\n");
  return;
}

Assistant:

void TeamCityTestOutput::printFailure(const TestFailure& failure)
{
    print("##teamcity[testFailed name='");
    printEscaped(failure.getTestNameOnly().asCharString());
    print("' message='");
    if (failure.isOutsideTestFile() || failure.isInHelperFunction()) {
        print("TEST failed (");
        print(failure.getTestFileName().asCharString());
        print(":");
        print(failure.getTestLineNumber());
        print("): ");
    }

    printEscaped(failure.getFileName().asCharString());
    print(":");
    print(failure.getFailureLineNumber());

    print("' details='");
    printEscaped(failure.getMessage().asCharString());
    print("']\n");
}